

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

int insertvar(char *s,attr *a)

{
  Env *this;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  this = current;
  std::__cxx11::string::string((string *)&local_38,s,&local_39);
  bVar1 = Env::insertvar(this,&local_38,a);
  std::__cxx11::string::~string((string *)&local_38);
  return (uint)bVar1;
}

Assistant:

int insertvar(const char *s, const struct attr *a) {
    return current->insertvar(s, *a);
}